

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::emsg::print(emsg *this)

{
  char cVar1;
  uint8_t *ptr;
  long lVar2;
  ostream *poVar3;
  uint size;
  sc35_splice_info l_splice;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"=================emsg==================");
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," e-msg box version: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout," scheme_id_uri:     ");
  poVar3 = std::operator<<(poVar3,(string *)&this->scheme_id_uri_);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," value:             ");
  poVar3 = std::operator<<(poVar3,(string *)&this->value_);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," timescale:         ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  cVar1 = (this->super_full_box).super_box.field_0x62;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  if (cVar1 == '\x01') {
    poVar3 = std::operator<<((ostream *)&std::cout," presentation_time: ");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout," presentation_time_delta: ");
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," event duration:    ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," event id           ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout," message data size  ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  ptr = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (*ptr == 0xfc) {
    sc35_splice_info::parse(&l_splice,ptr,size);
    poVar3 = std::operator<<((ostream *)&std::cout,"=============splice info==============");
    std::endl<char,std::char_traits<char>>(poVar3);
    sc35_splice_info::print(&l_splice,false);
  }
  return;
}

Assistant:

void emsg::print() const
	{
		std::cout << "=================emsg==================" << std::endl;
		std::cout << std::setw(33) << std::left << " e-msg box version: " << (unsigned int)version_ << std::endl;
		std::cout << " scheme_id_uri:     " << scheme_id_uri_ << std::endl;
		std::cout << std::setw(33) << std::left << " value:             " << value_ << std::endl;
		std::cout << std::setw(33) << std::left << " timescale:         " << timescale_ << std::endl;
		if (version_ == 1)
			std::cout << std::setw(33) << std::left << " presentation_time: " << presentation_time_ << std::endl;
		else
			std::cout << std::setw(33) << std::left << " presentation_time_delta: " << presentation_time_delta_ << std::endl;
		std::cout << std::setw(33) << std::left << " event duration:    " << event_duration_ << std::endl;
		std::cout << std::setw(33) << std::left << " event id           " << id_ << std::endl;
		std::cout << std::setw(33) << std::left << " message data size  " << message_data_.size() << std::endl;

		//print_payload

		if (message_data_[0] == 0xFC)
		{
			// splice table
			//cout << " scte splice info" << endl;
			sc35_splice_info l_splice;
			l_splice.parse((uint8_t*)&message_data_[0], (unsigned int)message_data_.size());
			std::cout << "=============splice info==============" << std::endl;
			l_splice.print();
		}
	}